

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTableCell::isValid(QAccessibleTableCell *this)

{
  bool bVar1;
  QWidgetPrivate *pQVar2;
  QAbstractItemModel *pQVar3;
  QAbstractItemView *unaff_retaddr;
  byte local_9;
  
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractItemView> *)0x7f9ebf);
  local_9 = 0;
  if (bVar1) {
    ::QPointer::operator_cast_to_QAbstractItemView_((QPointer<QAbstractItemView> *)0x7f9edb);
    pQVar2 = qt_widget_private((QWidget *)0x7f9ee3);
    local_9 = 0;
    if ((*(uint *)&(pQVar2->data).field_0x10 >> 0x12 & 1) == 0) {
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f9f07);
      pQVar3 = QAbstractItemView::model(unaff_retaddr);
      local_9 = 0;
      if (pQVar3 != (QAbstractItemModel *)0x0) {
        local_9 = QPersistentModelIndex::isValid();
      }
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool QAccessibleTableCell::isValid() const
{
    return view && !qt_widget_private(view)->data.in_destructor
            && view->model() && m_index.isValid();
}